

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte bVar2;
  char_t *pcVar3;
  char_t *pcVar4;
  byte *s_00;
  bool bVar5;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  s_00 = (byte *)s;
LAB_00116990:
  do {
    if (((anonymous_namespace)::chartype_table[*s_00] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[s_00[1]] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_001169fb;
      }
      if (((anonymous_namespace)::chartype_table[s_00[2]] & 1) != 0) {
        s_00 = s_00 + 2;
        goto LAB_001169fb;
      }
      pbVar1 = s_00 + 3;
      bVar5 = ((anonymous_namespace)::chartype_table[s_00[3]] & 1) == 0;
      s_00 = s_00 + 4;
      if (!bVar5) {
        s_00 = pbVar1;
      }
    }
    else {
LAB_001169fb:
      bVar5 = false;
    }
  } while (bVar5);
  bVar2 = *s_00;
  if (bVar2 == 0x26) {
    s_00 = (byte *)strconv_escape((char_t *)s_00,&local_38);
    goto LAB_00116990;
  }
  if (bVar2 == 0) {
    pcVar3 = gap::flush(&local_38,(char_t *)s_00);
    goto LAB_00116a34;
  }
  if (bVar2 != 0x3c) {
    s_00 = s_00 + 1;
    goto LAB_00116990;
  }
  pcVar3 = gap::flush(&local_38,(char_t *)s_00);
  do {
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
    pcVar3 = pcVar4 + -1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar4[-1]] & 8) != 0);
  *pcVar4 = '\0';
  return (char_t *)(s_00 + 1);
  while (pcVar3 = pcVar4 + -1, ((anonymous_namespace)::chartype_table[(byte)pcVar4[-1]] & 8) != 0) {
LAB_00116a34:
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
  }
  *pcVar4 = '\0';
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}